

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_bcast_2phase(bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
                bsc_size_t n)

{
  long lVar1;
  void *pvVar2;
  void *dst;
  int iVar3;
  bsp_pid_t bVar4;
  int iVar5;
  bsc_pid_t local_b8;
  bsc_pid_t local_b0;
  int local_a8;
  int local_a4;
  int local_98;
  int local_90;
  int local_8c;
  bsc_size_t next_j_1;
  bsc_size_t next_b_1;
  bsc_size_t e_1;
  bsc_size_t block_remaining_1;
  bsc_size_t next_j;
  bsc_size_t next_b;
  bsc_size_t e;
  bsc_size_t block_remaining;
  bsc_size_t block_end;
  bsc_size_t block_begin;
  char *dst_bytes;
  char *src_bytes;
  bsc_size_t my_start_j;
  bsc_size_t j;
  bsc_size_t my_block_size;
  bsc_size_t my_start_b;
  bsc_size_t b;
  bsc_size_t block;
  bsc_size_t total_size;
  bsc_size_t i;
  bsc_pid_t s;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    local_98 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    bVar4 = bsp_pid();
    local_98 = *(int *)(lVar1 + (long)bVar4 * 4);
  }
  b = 0;
  j = -1;
  my_start_j = -1;
  src_bytes._0_4_ = -1;
  for (block = 0; block < n; block = block + 1) {
    b = params[block].size + b;
  }
  iVar5 = (b + iVar3 + -1) / iVar3;
  my_block_size = 0;
  src_bytes._4_4_ = 0;
  for (block = 0; block < iVar3; block = block + 1) {
    if (b < block * iVar5) {
      local_a4 = b;
    }
    else {
      local_a4 = block * iVar5;
    }
    if (b < (block + 1) * iVar5) {
      local_a8 = b;
    }
    else {
      local_a8 = (block + 1) * iVar5;
    }
    next_b = local_a8 - local_a4;
    if (block == local_98) {
      src_bytes._0_4_ = src_bytes._4_4_;
      j = my_block_size;
      my_start_j = next_b;
    }
    do {
      block_remaining_1 = my_block_size + next_b;
      e_1 = src_bytes._4_4_;
      next_j = block_remaining_1;
      if (params[src_bytes._4_4_].size < block_remaining_1) {
        next_j = params[src_bytes._4_4_].size;
        e_1 = src_bytes._4_4_ + 1;
        block_remaining_1 = 0;
      }
      pvVar2 = params[src_bytes._4_4_].src;
      dst = params[src_bytes._4_4_].dst;
      bVar4 = bsp_pid();
      if (bVar4 == root) {
        if (group == (bsc_group_t)0x0) {
          local_b0 = block;
        }
        else {
          local_b0 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)block * 4);
        }
        bsc_put(depends,local_b0,(void *)((long)pvVar2 + (long)my_block_size),dst,my_block_size,
                next_j - my_block_size);
      }
      next_b = next_b - (next_j - my_block_size);
      src_bytes._4_4_ = e_1;
      my_block_size = block_remaining_1;
    } while (0 < next_b);
  }
  for (block = 0; block < iVar3; block = block + 1) {
    next_b_1 = my_start_j;
    my_block_size = j;
    src_bytes._4_4_ = (bsc_size_t)src_bytes;
    do {
      local_8c = my_block_size + next_b_1;
      local_90 = src_bytes._4_4_;
      next_j_1 = local_8c;
      if (params[src_bytes._4_4_].size < local_8c) {
        next_j_1 = params[src_bytes._4_4_].size;
        local_90 = src_bytes._4_4_ + 1;
        local_8c = 0;
      }
      if (group == (bsc_group_t)0x0) {
        local_b8 = block;
      }
      else {
        local_b8 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)block * 4);
      }
      bsc_put(depends + 1,local_b8,(void *)((long)params[src_bytes._4_4_].dst + (long)my_block_size)
              ,params[src_bytes._4_4_].dst,my_block_size,next_j_1 - my_block_size);
      next_b_1 = next_b_1 - (next_j_1 - my_block_size);
      src_bytes._4_4_ = local_90;
      my_block_size = local_8c;
    } while (0 < next_b_1);
  }
  return depends + 2;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_bcast_2phase( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n )
{
    const group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_pid_t s = g?g->lid[bsp_pid()]:bsp_pid();
    bsc_size_t i, total_size = 0;
    bsc_size_t block;
    bsc_size_t b, my_start_b=-1, my_block_size=-1;
    bsc_size_t j, my_start_j=-1;
    const char * src_bytes;
    char * dst_bytes;
 
    /* compute preferred block size */
    for ( i = 0 ; i < n; ++i )
        total_size += params[i].size;
    block = (total_size + P - 1)/P;
   
    /* the root scatters, all compute the block for the
     * following all-gather */
    b = 0; j = 0;
    for ( i = 0 ; i < P; ++i) {
        bsc_size_t block_begin = MIN(     i*block, total_size);
        bsc_size_t block_end   = MIN( (i+1)*block, total_size);
        bsc_size_t block_remaining = block_end - block_begin;

        if (i == s ) {
            my_start_j = j;
            my_start_b = b;
            my_block_size = block_remaining;
        }
        
        do {
            bsc_size_t e = b + block_remaining;
            bsc_size_t next_b = e;
            bsc_size_t next_j = j;
            if (e > params[j].size) {
                e = params[j].size;
                next_j = j+1;
                next_b = 0;
            }
            src_bytes = params[j].src;
            dst_bytes = params[j].dst;
            if (bsp_pid() == root ) 
                bsc_put( depends, g?g->gid[i]:i, 
                        src_bytes + b, dst_bytes, b, e - b);
            block_remaining -= (e-b);
            j = next_j;
            b = next_b;
        } while ( block_remaining > 0 ) ;

    }
    depends += 1;
    /* the all-gather */
    for ( i = 0; i < P; ++i ) {
        bsc_size_t block_remaining = my_block_size;
        b = my_start_b;
        j = my_start_j;

        do {
            bsc_size_t e = b + block_remaining;
            bsc_size_t next_b = e;
            bsc_size_t next_j = j;
            if (e > params[j].size) {
                e = params[j].size;
                next_j = j+1;
                next_b = 0;
            }
            src_bytes = params[j].src;
            dst_bytes = params[j].dst;
            bsc_put( depends, g?g->gid[i]:i, 
                    dst_bytes + b, dst_bytes, b, e - b);
            block_remaining -= (e-b);
            j = next_j;
            b = next_b;
        } while ( block_remaining > 0 ) ;
    }
    return depends+1;
}